

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromInteger(HelicsDataBuffer data,int64_t value)

{
  SmallBuffer *store;
  int32_t iVar1;
  int64_t local_18;
  
  local_18 = value;
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    helics::ValueConverter<long>::convert(&local_18,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromInteger(HelicsDataBuffer data, int64_t value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<int64_t>::convert(value, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}